

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_create_desc(JSContext *ctx,JSValue val,JSValue getter,JSValue setter,int flags)

{
  JSValue v;
  JSValue v_00;
  int iVar1;
  JSValueUnion in_RCX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  int64_t in_R8;
  uint in_R9D;
  JSValue v_01;
  JSValue in_stack_00000008;
  JSValue ret;
  undefined8 in_stack_ffffffffffffff10;
  JSAtom prop;
  JSContext *in_stack_ffffffffffffff18;
  JSValue in_stack_ffffffffffffff20;
  JSValue in_stack_ffffffffffffff30;
  undefined4 uStack_c;
  
  prop = (JSAtom)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  v_01 = JS_NewObject((JSContext *)0x17d1c1);
  iVar1 = JS_IsException(v_01);
  if (iVar1 == 0) {
    iVar1 = v_01.u._0_4_;
    if ((in_R9D & 0x800) != 0) {
      v.tag = in_R8;
      v.u.float64 = in_RCX.float64;
      JS_DupValue(in_RDI,v);
      JS_DefinePropertyValue
                (in_stack_ffffffffffffff18,in_stack_ffffffffffffff30,prop,in_stack_ffffffffffffff20,
                 iVar1);
    }
    if ((in_R9D & 0x1000) != 0) {
      in_stack_ffffffffffffff30 = JS_DupValue(in_RDI,in_stack_00000008);
      JS_DefinePropertyValue
                (in_stack_ffffffffffffff18,in_stack_ffffffffffffff30,prop,in_stack_ffffffffffffff20,
                 iVar1);
    }
    if ((in_R9D & 0x2000) != 0) {
      v_00.tag = in_RDX;
      v_00.u.float64 = in_RSI.float64;
      in_stack_ffffffffffffff20 = JS_DupValue(in_RDI,v_00);
      JS_DefinePropertyValue
                (in_stack_ffffffffffffff18,in_stack_ffffffffffffff30,prop,in_stack_ffffffffffffff20,
                 iVar1);
    }
    if ((in_R9D & 0x200) != 0) {
      in_stack_ffffffffffffff18 = (JSContext *)0x1;
      prop = uStack_c;
      JS_DefinePropertyValue
                ((JSContext *)0x1,in_stack_ffffffffffffff30,uStack_c,in_stack_ffffffffffffff20,iVar1
                );
    }
    if ((in_R9D & 0x400) != 0) {
      JS_DefinePropertyValue
                (in_stack_ffffffffffffff18,in_stack_ffffffffffffff30,prop,in_stack_ffffffffffffff20,
                 iVar1);
    }
    if ((in_R9D & 0x100) != 0) {
      JS_DefinePropertyValue
                (in_stack_ffffffffffffff18,in_stack_ffffffffffffff30,prop,in_stack_ffffffffffffff20,
                 iVar1);
    }
  }
  return v_01;
}

Assistant:

static JSValue js_create_desc(JSContext *ctx, JSValueConst val,
                              JSValueConst getter, JSValueConst setter,
                              int flags)
{
    JSValue ret;
    ret = JS_NewObject(ctx);
    if (JS_IsException(ret))
        return ret;
    if (flags & JS_PROP_HAS_GET) {
        JS_DefinePropertyValue(ctx, ret, JS_ATOM_get, JS_DupValue(ctx, getter),
                               JS_PROP_C_W_E);
    }
    if (flags & JS_PROP_HAS_SET) {
        JS_DefinePropertyValue(ctx, ret, JS_ATOM_set, JS_DupValue(ctx, setter),
                               JS_PROP_C_W_E);
    }
    if (flags & JS_PROP_HAS_VALUE) {
        JS_DefinePropertyValue(ctx, ret, JS_ATOM_value, JS_DupValue(ctx, val),
                               JS_PROP_C_W_E);
    }
    if (flags & JS_PROP_HAS_WRITABLE) {
        JS_DefinePropertyValue(ctx, ret, JS_ATOM_writable,
                               JS_NewBool(ctx, (flags & JS_PROP_WRITABLE) != 0),
                               JS_PROP_C_W_E);
    }
    if (flags & JS_PROP_HAS_ENUMERABLE) {
        JS_DefinePropertyValue(ctx, ret, JS_ATOM_enumerable,
                               JS_NewBool(ctx, (flags & JS_PROP_ENUMERABLE) != 0),
                               JS_PROP_C_W_E);
    }
    if (flags & JS_PROP_HAS_CONFIGURABLE) {
        JS_DefinePropertyValue(ctx, ret, JS_ATOM_configurable,
                               JS_NewBool(ctx, (flags & JS_PROP_CONFIGURABLE) != 0),
                               JS_PROP_C_W_E);
    }
    return ret;
}